

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

TokenType __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
matchNextToken(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               *this)

{
  UTF8Reader *this_00;
  char *pcVar1;
  bool bVar2;
  UnicodeChar UVar3;
  UnicodeChar UVar4;
  TokenType TVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  uint uVar6;
  int numToSkip;
  TokenType local_90;
  CompileMessage local_88;
  UTF8Reader end;
  char local_40 [16];
  UTF8Reader local_30;
  
  this_00 = &this->input;
  UVar3 = UTF8Reader::operator*(this_00);
  bVar2 = IdentifierMatcher::isIdentifierStart(UVar3);
  if (bVar2) {
    end.data = this_00->data;
    uVar6 = 1;
    while( true ) {
      UTF8Reader::operator++(&end);
      UVar3 = UTF8Reader::operator*(&end);
      bVar2 = IdentifierMatcher::isIdentifierBody(UVar3);
      if (!bVar2) break;
      if (0xff < uVar6) {
        Errors::identifierTooLong<>();
        (*this->_vptr_Tokeniser[2])(this,&local_88);
        CompileMessage::~CompileMessage(&local_88);
      }
      uVar6 = uVar6 + 1;
    }
    local_88.description._M_dataplus._M_p = (pointer)&local_88.description.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,this_00->data,end.data);
    std::__cxx11::string::operator=((string *)&this->currentStringValue,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    (this->input).data = end.data;
    TVar5 = IdentifierMatcher::categoriseIdentifier(&this->currentStringValue);
    return (TokenType)TVar5.text;
  }
  if ((byte)(*this_00->data - 0x30U) < 10) {
    TVar5 = parseNumericLiteral(this,false);
    return (TokenType)TVar5.text;
  }
  UVar3 = UTF8Reader::operator*(this_00);
  numToSkip = (int)this_00;
  if ((UVar3 == 0x2d) &&
     (UTF8Reader::operator+((UTF8Reader *)&local_88,numToSkip),
     (byte)(*local_88.description._M_dataplus._M_p - 0x30U) < 10)) {
    UTF8Reader::operator++(this_00);
    local_90 = parseNumericLiteral(this,true);
    bVar2 = TokenType::operator==(&local_90,(TokenType *)&Token::literalInt32);
    if ((!bVar2) &&
       (bVar2 = TokenType::operator==(&local_90,(TokenType *)&Token::literalInt64), !bVar2)) {
      this->literalDoubleValue = -this->literalDoubleValue;
      return (TokenType)local_90.text;
    }
    this->literalIntValue = -this->literalIntValue;
    return (TokenType)local_90.text;
  }
  bVar2 = parseStringLiteral(this,UVar3);
  if (bVar2) {
    return (TokenType)"$string literal";
  }
  if (UVar3 == 0x2f) {
    if (this->shouldIgnoreComments == false) {
      UTF8Reader::operator+((UTF8Reader *)&local_88,numToSkip);
      UVar4 = UTF8Reader::operator*((UTF8Reader *)&local_88);
      if (UVar4 == 0x2a) {
        (this->location).location.data = (this->input).data;
        UTF8Reader::operator+((UTF8Reader *)&local_88,numToSkip);
        UTF8Reader::find(&end,(char *)&local_88);
        if (*end.data == '\0') {
          Errors::unterminatedComment<>();
          (*this->_vptr_Tokeniser[2])(this,&local_88);
          CompileMessage::~CompileMessage(&local_88);
        }
        UTF8Reader::operator+=(&end,2);
        local_88.description._M_dataplus._M_p = (pointer)&local_88.description.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,this_00->data,end.data);
        std::__cxx11::string::operator=((string *)&this->currentStringValue,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
      else {
        if (UVar4 != 0x2f) goto LAB_00225880;
        UTF8Reader::find(&end,(char *)this_00);
        local_88.description._M_dataplus._M_p = (pointer)&local_88.description.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,(this->input).data,end.data);
        std::__cxx11::string::operator=((string *)&this->currentStringValue,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
      (this->input).data = end.data;
      return (TokenType)"$comment";
    }
  }
  else if ((UVar3 == 0x2e) && (bVar2 = parseFloatLiteral(this), bVar2)) {
    return (TokenType)(this->literalType).text;
  }
LAB_00225880:
  local_90 = HEARTOperator::Matcher::match(this_00);
  if (local_90.text == (char *)0x0) {
    if (UVar3 == 0x5f) {
      UTF8Reader::operator+((UTF8Reader *)&local_88,numToSkip);
      UVar3 = UTF8Reader::operator*((UTF8Reader *)&local_88);
      bVar2 = IdentifierMatcher::isIdentifierBody(UVar3);
      if (bVar2) {
        Errors::noLeadingUnderscoreAllowed<>();
        (*this->_vptr_Tokeniser[2])(this,&local_88);
        CompileMessage::~CompileMessage(&local_88);
      }
    }
    pcVar1 = this_00->data;
    if (*pcVar1 != '\0') {
      UTF8Reader::operator+(&local_30,numToSkip);
      end.data = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&end,pcVar1,local_30.data);
      Errors::illegalCharacter<std::__cxx11::string>(&local_88,(Errors *)&end,args);
      (*this->_vptr_Tokeniser[2])(this,&local_88);
      CompileMessage::~CompileMessage(&local_88);
      std::__cxx11::string::~string((string *)&end);
    }
    local_90.text = "$eof";
  }
  return (TokenType)local_90.text;
}

Assistant:

TokenType matchNextToken()
    {
        if (IdentifierMatcher::isIdentifierStart (*input))
        {
            auto end = input;
            int len = 1;

            while (IdentifierMatcher::isIdentifierBody (*++end))
                if (++len > (int) maxIdentifierLength)
                    throwError (Errors::identifierTooLong());

            if (auto keyword = KeywordList::match (len, input))
            {
                input += len;
                return keyword;
            }

            currentStringValue = std::string (input.getAddress(), end.getAddress());
            input = end;
            return IdentifierMatcher::categoriseIdentifier (currentStringValue);
        }

        if (input.isDigit())
            return parseNumericLiteral (false);

        auto currentChar = *input;

        if (currentChar == '-' && (input + 1).isDigit())
        {
            ++input;
            auto tok = parseNumericLiteral (true);

            if (tok == Token::literalInt32 || tok == Token::literalInt64)
                literalIntValue = -literalIntValue;
            else
                literalDoubleValue = -literalDoubleValue;

            return tok;
        }

        if (parseStringLiteral (currentChar))
            return Token::literalString;

        if (currentChar == '.' && parseFloatLiteral())
            return literalType;

        if (currentChar == '/' && ! shouldIgnoreComments)
        {
            auto c2 = *(input + 1);

            if (c2 == '/')
            {
                auto end = input.find ("\n");
                currentStringValue = std::string (input.getAddress(), end.getAddress());
                input = end;
                return Token::comment;
            }

            if (c2 == '*')
            {
                location.location = input;
                auto end = (input + 2).find ("*/");
                if (end.isEmpty()) throwError (Errors::unterminatedComment());
                end += 2;
                currentStringValue = std::string (input.getAddress(), end.getAddress());
                input = end;
                return Token::comment;
            }
        }

        if (auto op = OperatorList::match (input))
            return op;

        if (currentChar == '_' && IdentifierMatcher::isIdentifierBody (*(input + 1)))
            throwError (Errors::noLeadingUnderscoreAllowed());

        if (! input.isEmpty())
            throwError (Errors::illegalCharacter (std::string (input.getAddress(), (input + 1).getAddress())));

        return Token::eof;
    }